

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_v3.cc
# Opt level: O0

int X509_EXTENSION_set_critical(X509_EXTENSION *ex,int crit)

{
  ASN1_BOOLEAN AVar1;
  int crit_local;
  X509_EXTENSION *ex_local;
  
  if (ex == (X509_EXTENSION *)0x0) {
    ex_local._4_4_ = 0;
  }
  else {
    AVar1 = -1;
    if (crit != 0) {
      AVar1 = 0xff;
    }
    ex->critical = AVar1;
    ex_local._4_4_ = 1;
  }
  return ex_local._4_4_;
}

Assistant:

int X509_EXTENSION_set_critical(X509_EXTENSION *ex, int crit) {
  if (ex == NULL) {
    return 0;
  }
  // The critical field is DEFAULT FALSE, so non-critical extensions should omit
  // the value.
  ex->critical = crit ? ASN1_BOOLEAN_TRUE : ASN1_BOOLEAN_NONE;
  return 1;
}